

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  int iVar1;
  undefined1 auStack_58 [4];
  int nexps;
  LHS_assign nv;
  expdesc e;
  int nvars_local;
  LHS_assign *lh_local;
  LexState *ls_local;
  
  if ((VNONRELOC < (lh->v).k) && ((lh->v).k < VJMP)) {
    iVar1 = testnext(ls,0x2c);
    if (iVar1 == 0) {
      checknext(ls,0x3d);
      iVar1 = explist(ls,(expdesc *)&nv.v.t);
      if (iVar1 == nvars) {
        luaK_setoneret(ls->fs,(expdesc *)&nv.v.t);
        luaK_storevar(ls->fs,&lh->v,(expdesc *)&nv.v.t);
        return;
      }
      adjust_assign(ls,nvars,iVar1,(expdesc *)&nv.v.t);
    }
    else {
      _auStack_58 = lh;
      suffixedexp(ls,(expdesc *)&nv);
      if ((int)nv.prev != 10) {
        check_conflict(ls,lh,(expdesc *)&nv);
      }
      checklimit(ls->fs,nvars + (uint)ls->L->nCcalls,200,"C levels");
      assignment(ls,(LHS_assign *)auStack_58,nvars + 1);
    }
    init_exp((expdesc *)&nv.v.t,VNONRELOC,ls->fs->freereg - 1);
    luaK_storevar(ls->fs,&lh->v,(expdesc *)&nv.v.t);
    return;
  }
  luaX_syntaxerror(ls,"syntax error");
}

Assistant:

static void assignment (LexState *ls, struct LHS_assign *lh, int nvars) {
  expdesc e;
  check_condition(ls, vkisvar(lh->v.k), "syntax error");
  if (testnext(ls, ',')) {  /* assignment -> ',' suffixedexp assignment */
    struct LHS_assign nv;
    nv.prev = lh;
    suffixedexp(ls, &nv.v);
    if (nv.v.k != VINDEXED)
      check_conflict(ls, lh, &nv.v);
    checklimit(ls->fs, nvars + ls->L->nCcalls, LUAI_MAXCCALLS,
                    "C levels");
    assignment(ls, &nv, nvars+1);
  }
  else {  /* assignment -> '=' explist */
    int nexps;
    checknext(ls, '=');
    nexps = explist(ls, &e);
    if (nexps != nvars)
      adjust_assign(ls, nvars, nexps, &e);
    else {
      luaK_setoneret(ls->fs, &e);  /* close last expression */
      luaK_storevar(ls->fs, &lh->v, &e);
      return;  /* avoid default */
    }
  }
  init_exp(&e, VNONRELOC, ls->fs->freereg-1);  /* default assignment */
  luaK_storevar(ls->fs, &lh->v, &e);
}